

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.cc
# Opt level: O2

void WriteDebugMetrics(ofstream *stream,Metrics *metrics)

{
  pointer ppVar1;
  ostream *poVar2;
  int i;
  ulong uVar3;
  
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)stream);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  for (uVar3 = 0;
      ppVar1 = (metrics->scoreVsTrue).
               super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(metrics->scoreVsTrue).
                            super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1 >> 3);
      uVar3 = uVar3 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<(stream,ppVar1[uVar3].first);
    poVar2 = std::operator<<(poVar2,";");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       (poVar2,(metrics->scoreVsTrue).
                               super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar3].second);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

void WriteDebugMetrics(ofstream& stream, Meter::Metrics& metrics)
{
    stream << metrics.gold << endl << metrics.predicted << endl << metrics.predictedGold << endl << metrics.scoreVsTrue.size() << endl;
    for (int i = 0; i<metrics.scoreVsTrue.size(); ++i) {
        stream << metrics.scoreVsTrue[i].first << ";" << metrics.scoreVsTrue[i].second << endl;
    }
}